

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeImpl.cc
# Opt level: O2

SchemaResolution __thiscall avro::NodeUnion::resolve(NodeUnion *this,Node *reader)

{
  int iVar1;
  SchemaResolution SVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SchemaResolution SVar3;
  size_t i;
  ulong uVar4;
  
  uVar4 = 0;
  SVar3 = RESOLVE_NO_MATCH;
  while( true ) {
    iVar1 = (*(this->super_NodeImplUnion).super_Node._vptr_Node[4])(this);
    if (CONCAT44(extraout_var,iVar1) <= uVar4) {
      return SVar3;
    }
    iVar1 = (*(this->super_NodeImplUnion).super_Node._vptr_Node[5])(this,uVar4 & 0xffffffff);
    SVar2 = (**(code **)(**(long **)CONCAT44(extraout_var_00,iVar1) + 0x60))
                      (*(long **)CONCAT44(extraout_var_00,iVar1),reader);
    if (SVar2 == RESOLVE_MATCH) break;
    if (SVar3 == RESOLVE_NO_MATCH) {
      SVar3 = SVar2;
    }
    uVar4 = uVar4 + 1;
  }
  return RESOLVE_MATCH;
}

Assistant:

SchemaResolution
NodeUnion::resolve(const Node &reader) const 
{

    // If the writer is union, resolution only needs to occur when the selected
    // type of the writer is known, so this function is not very helpful.
    //
    // In this case, this function returns if there is a possible match given
    // any writer type, so just search type by type returning the best match
    // found.
    
    SchemaResolution match = RESOLVE_NO_MATCH;
    for(size_t i=0; i < leaves(); ++i) {
        const NodePtr &node = leafAt(i);
        SchemaResolution thisMatch = node->resolve(reader);
        if(thisMatch == RESOLVE_MATCH) {
            match = thisMatch;
            break;
        }
        if(match == RESOLVE_NO_MATCH) {
            match = thisMatch;
        }
    }
    return match;
}